

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O1

int write_misa(CPURISCVState_conflict2 *env,int csrno,target_ulong val)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  CPURISCVState_conflict2 *__mptr;
  ulong uVar4;
  ulong unaff_retaddr;
  
  if ((((val & 0x10) == 0) && ((val & 0x110) != 0)) && ((env->features & 4) != 0)) {
    uVar3 = val & env->misa_mask;
    uVar2 = (uint)uVar3;
    uVar1 = 0x14112d;
    if ((uVar2 & 0x28) == 8) {
      uVar1 = 0x141105;
    }
    uVar1 = uVar1 & uVar2;
    uVar4 = (ulong)uVar1;
    if (((uVar3 & 4) != 0) && (3 < unaff_retaddr)) {
      uVar4 = (ulong)(uVar1 & 0x141129);
    }
    uVar4 = env->misa & 0xc000000000000000 | uVar4;
    if (uVar4 != env->misa) {
      tb_flush_riscv64((CPUState *)&env[-0x18].pmp_state.num_rules);
    }
    env->misa = uVar4;
  }
  return 0;
}

Assistant:

static int write_misa(CPURISCVState *env, int csrno, target_ulong val)
{
    if (!riscv_feature(env, RISCV_FEATURE_MISA)) {
        /* drop write to misa */
        return 0;
    }

    /* 'I' or 'E' must be present */
    if (!(val & (RVI | RVE))) {
        /* It is not, drop write to misa */
        return 0;
    }

    /* 'E' excludes all other extensions */
    if (val & RVE) {
        /* when we support 'E' we can do "val = RVE;" however
         * for now we just drop writes if 'E' is present.
         */
        return 0;
    }

    /* Mask extensions that are not supported by this hart */
    val &= env->misa_mask;

    /* Mask extensions that are not supported by QEMU */
    val &= (RVI | RVE | RVM | RVA | RVF | RVD | RVC | RVS | RVU);

    /* 'D' depends on 'F', so clear 'D' if 'F' is not present */
    if ((val & RVD) && !(val & RVF)) {
        val &= ~RVD;
    }

    /* Suppress 'C' if next instruction is not aligned
     * TODO: this should check next_pc
     */
    if ((val & RVC) && (GETPC() & ~3) != 0) {
        val &= ~RVC;
    }

    /* misa.MXL writes are not supported by QEMU */
    val = (env->misa & MISA_MXL) | (val & ~MISA_MXL);

    /* flush translation cache */
    if (val != env->misa) {
        tb_flush(env_cpu(env));
    }

    env->misa = val;

    return 0;
}